

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O0

QList<QHstsPolicy> * __thiscall QHstsStore::readPolicies(QHstsStore *this)

{
  bool bVar1;
  const_iterator o;
  QString *key_00;
  QHstsStore *in_RDI;
  long in_FS_OFFSET;
  QString *key;
  QStringList *__range1;
  QList<QHstsPolicy> *policies;
  QHstsPolicy restoredPolicy;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList keys;
  QHstsStore *this_00;
  QHstsStore *in_stack_ffffffffffffff88;
  QHstsStore *this_01;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar2;
  byte bVar3;
  const_iterator local_28;
  Data *local_20;
  QHstsPolicy *local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  ((DataPointer *)&in_RDI->observedPolicies)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->observedPolicies)->ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->observedPolicies)->size = -0x5555555555555556;
  this_00 = in_RDI;
  QList<QHstsPolicy>::QList((QList<QHstsPolicy> *)0x28c266);
  beginHstsGroups(in_stack_ffffffffffffff88);
  local_20 = (Data *)0xaaaaaaaaaaaaaaaa;
  local_18 = (QHstsPolicy *)0xaaaaaaaaaaaaaaaa;
  local_10 = -0x5555555555555556;
  QSettings::childKeys();
  this_01 = (QHstsStore *)&stack0xffffffffffffffe0;
  local_28.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_28 = QList<QString>::begin((QList<QString> *)this_00);
  o = QList<QString>::end((QList<QString> *)this_00);
  while (bVar1 = QList<QString>::const_iterator::operator!=(&local_28,o), bVar1) {
    key_00 = QList<QString>::const_iterator::operator*(&local_28);
    QHstsPolicy::QHstsPolicy((QHstsPolicy *)this_00);
    bVar1 = deserializePolicy((QHstsStore *)CONCAT17(uVar2,in_stack_ffffffffffffff90),
                              (QString *)this_01,(QHstsPolicy *)key_00);
    if (bVar1) {
      settings_key_to_host_name((QString *)this_01);
      QHstsPolicy::setHost((QHstsPolicy *)this_00,(QString *)in_RDI,TolerantMode);
      QString::~QString((QString *)0x28c399);
      QList<QHstsPolicy>::push_back(&this_00->observedPolicies,(rvalue_ref)in_RDI);
    }
    else {
      bVar1 = isWritable((QHstsStore *)0x28c3b3);
      if (bVar1) {
        evictPolicy(this_01,key_00);
      }
    }
    QHstsPolicy::~QHstsPolicy((QHstsPolicy *)0x28c3d4);
    QList<QString>::const_iterator::operator++(&local_28);
  }
  endHstsGroups(this_00);
  bVar3 = 1;
  QList<QString>::~QList((QList<QString> *)0x28c3fc);
  if ((bVar3 & 1) == 0) {
    QList<QHstsPolicy>::~QList((QList<QHstsPolicy> *)0x28c40c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &this_00->observedPolicies;
}

Assistant:

QList<QHstsPolicy> QHstsStore::readPolicies()
{
    // This function only attempts to read policies, making no decision about
    // expired policies. It's up to a user (QHstsCache) to mark these policies
    // for deletion and sync the store later. But we immediately remove keys/values
    // (if the store isWritable) for the policies that we fail to read.
    QList<QHstsPolicy> policies;

    beginHstsGroups();

    const QStringList keys = store.childKeys();
    for (const auto &key : keys) {
        QHstsPolicy restoredPolicy;
        if (deserializePolicy(key, restoredPolicy)) {
            restoredPolicy.setHost(settings_key_to_host_name(key));
            policies.push_back(std::move(restoredPolicy));
        } else if (isWritable()) {
            evictPolicy(key);
        }
    }

    endHstsGroups();

    return policies;
}